

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<capnp::_::RawBrandedSchema::Binding>::~Array
          (Array<capnp::_::RawBrandedSchema::Binding> *this)

{
  Binding *pBVar1;
  size_t sVar2;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (Binding *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Binding *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)(this->disposer,pBVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }